

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst-epoll.c
# Opt level: O0

void * t1_func(void *arg)

{
  int __epfd;
  int __fd;
  ssize_t sVar1;
  undefined1 local_3031;
  int local_3030;
  int iStack_302c;
  char c;
  int r2;
  int r;
  epoll_event events [1024];
  int s_0;
  int ep;
  t1_args *t1_args;
  void *arg_local;
  
  __epfd = *arg;
  __fd = *(int *)((long)arg + 4);
  local_3030 = epoll_wait(__epfd,(epoll_event *)&r2,0x400,5000);
  if (((local_3030 != 1) || ((r2 & 1U) == 0)) || (r != 0x7b)) {
    microatf_fail_require
              ("%s:%d: epoll_wait in thread",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-epoll.c"
               ,0xd3);
  }
  sVar1 = read(__fd,&local_3031,1);
  local_3030 = (int)sVar1;
  if (local_3030 != 1) {
    microatf_fail_require
              ("%s:%d: read after poll",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-epoll.c"
               ,0xd7);
  }
  iStack_302c = epoll_wait(__epfd,(epoll_event *)&r2,0x400,0);
  if (iStack_302c != 0) {
    microatf_fail_require
              ("%s:%d: epoll after read",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-epoll.c"
               ,0xda);
  }
  return (void *)0x0;
}

Assistant:

static void *
t1_func(void *arg)
{
	struct t1_args *t1_args = arg;
	int ep = t1_args->ep;
	int s_0 = t1_args->s_0;
	struct epoll_event events[MAXEVENTS];
	int r;

	int r2 = epoll_wait(ep, events, MAXEVENTS, 5000);
	ATF_REQUIRE_MSG(r2 == 1 && (events[0].events & EPOLLIN) &&
		(events[0].data.u32 == 123),
	    "epoll_wait in thread");

	char c;
	r2 = (int)read(s_0, &c, 1);
	ATF_REQUIRE_MSG(r2 == 1, "read after poll");

	r = epoll_wait(ep, events, MAXEVENTS, 0);
	ATF_REQUIRE_MSG(r == 0, "epoll after read");

	return NULL;
}